

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

string * cmCTest::SafeBuildIdField(string *__return_storage_ptr__,string *value)

{
  pointer pcVar1;
  int iVar2;
  ulong in_RAX;
  long lVar3;
  char replace [2];
  undefined8 uStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  uStack_38 = in_RAX;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + value->_M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
  if (iVar2 != 0) {
    lVar3 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x628aab,0);
    if (lVar3 != -1) {
      uStack_38 = uStack_38 & 0xffffffffffffff;
      lVar3 = 0;
      do {
        uStack_38._0_7_ = CONCAT16("\\:*?\"<>|\n\r\t\f\v"[lVar3],(undefined6)uStack_38);
        cmsys::SystemTools::ReplaceString(__return_storage_ptr__,(char *)((long)&uStack_38 + 6),"");
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0xd);
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
  if (iVar2 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x628ab9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::SafeBuildIdField(const std::string& value)
{
  std::string safevalue(value);

  if (safevalue != "") {
    // Disallow non-filename and non-space whitespace characters.
    // If they occur, replace them with ""
    //
    const char* disallowed = "\\:*?\"<>|\n\r\t\f\v";

    if (safevalue.find_first_of(disallowed) != std::string::npos) {
      std::string::size_type i = 0;
      std::string::size_type n = strlen(disallowed);
      char replace[2];
      replace[1] = 0;

      for (i = 0; i < n; ++i) {
        replace[0] = disallowed[i];
        cmSystemTools::ReplaceString(safevalue, replace, "");
      }
    }
  }

  if (safevalue == "") {
    safevalue = "(empty)";
  }

  return safevalue;
}